

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.cc
# Opt level: O2

void google::protobuf::internal::InitImplicitWeakMessageDefaultInstance(void)

{
  _DAT_003f19c8 = 0;
  implicit_weak_message_default_instance = &PTR__ImplicitWeakMessage_003deb38;
  DAT_003f19d0 = &DAT_003f19e0;
  DAT_003f19d8 = 0;
  DAT_003f19e0 = 0;
  return;
}

Assistant:

void InitImplicitWeakMessageDefaultInstance() {
  implicit_weak_message_default_instance.DefaultConstruct();
}